

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

void enet_host_destroy(ENetHost *host)

{
  long in_RDI;
  int i;
  ENetPeer *currentPeer;
  int local_14;
  
  if (in_RDI != 0) {
    enet_socket_destroy(0);
    for (local_14 = 0; (ulong)(long)local_14 < *(ulong *)(in_RDI + 0x30); local_14 = local_14 + 1) {
      enet_peer_reset((ENetPeer *)0x1053bb);
      enet_free((void *)0x1053c5);
      *(undefined8 *)(*(long *)(in_RDI + 0x28) + (long)local_14 * 8) = 0;
    }
    if ((*(long *)(in_RDI + 0xad8) != 0) && (*(long *)(in_RDI + 0xaf0) != 0)) {
      (**(code **)(in_RDI + 0xaf0))(*(undefined8 *)(in_RDI + 0xad8));
    }
    enet_free((void *)0x10542e);
    enet_free((void *)0x105438);
  }
  return;
}

Assistant:

void
enet_host_destroy (ENetHost * host)
{
    ENetPeer * currentPeer;
    int i;

    if (host == NULL)
      return;

    enet_socket_destroy (host -> socket);

    for (i = 0; i < host -> peerCount; i++ )
    {
       currentPeer = host -> peer_list[i];
       enet_peer_reset (currentPeer);
       enet_free (currentPeer);
       host -> peer_list[i] = NULL;
    }

    if (host -> compressor.context != NULL && host -> compressor.destroy)
      (* host -> compressor.destroy) (host -> compressor.context);

    enet_free (host -> peer_list);
    enet_free (host);
}